

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void __thiscall FPolyMirrorIterator::FPolyMirrorIterator(FPolyMirrorIterator *this,FPolyObj *poly)

{
  this->CurPoly = poly;
  if (poly != (FPolyObj *)0x0) {
    this->UsedPolys[0] = poly->tag;
  }
  this->NumUsedPolys = (uint)(poly != (FPolyObj *)0x0);
  return;
}

Assistant:

FPolyMirrorIterator::FPolyMirrorIterator(FPolyObj *poly)
{
	CurPoly = poly;
	if (poly != NULL)
	{
		UsedPolys[0] = poly->tag;
		NumUsedPolys = 1;
	}
	else
	{
		NumUsedPolys = 0;
	}
}